

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_resolve.cpp
# Opt level: O1

void __thiscall tst_qpromise_resolve::value(tst_qpromise_resolve *this)

{
  int *piVar1;
  QSharedData *pQVar2;
  PromiseDataBase<int,_void_(const_int_&)> *pPVar3;
  long lVar4;
  long *plVar5;
  PromiseResolver<void> PVar6;
  _func_int **pp_Var7;
  bool bVar8;
  char cVar9;
  byte bVar10;
  char *pcVar11;
  char *pcVar12;
  PromiseDataBase<void,_void_()> *this_00;
  char *reject;
  QSharedData *pQVar13;
  long lVar14;
  undefined **ppuVar15;
  bool bVar16;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_138;
  PromiseResolver<void> resolver;
  undefined8 uStack_128;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_120;
  undefined **local_118;
  PromiseData<int> *local_110;
  undefined **local_108;
  PromiseData<int> *local_100;
  undefined **local_f8;
  PromiseData<int> *local_f0;
  undefined **local_e8;
  QPromise<int> p2;
  QPromise<int> p1;
  QPromise<void> local_c0;
  QPromise<int> p0;
  int v1;
  _Any_data local_98;
  _Manager_type local_88;
  _Invoker_type p_Stack_80;
  _func_int **local_78;
  _func_int **local_70;
  _func_int **local_68;
  _func_int **local_60;
  int v0;
  _Any_data local_50;
  code *local_40;
  
  v0 = 0x2a;
  v1 = 0x2a;
  local_118 = (undefined **)CONCAT44(local_118._4_4_,0x2a);
  QtPromise::QPromiseBase<int>::
  QPromiseBase<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_include____src_qtpromise_qpromise_inl:263:24),_0>
            (&p0.super_QPromiseBase<int>,(anon_class_8_1_a8c68091)&local_118);
  p0.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011b880;
  QtPromise::QPromiseBase<int>::
  QPromiseBase<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_include____src_qtpromise_qpromise_inl:255:24),_0>
            (&p1.super_QPromiseBase<int>,(anon_class_8_1_a8c68091)&v0);
  p1.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011b880;
  QtPromise::QPromiseBase<int>::
  QPromiseBase<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_include____src_qtpromise_qpromise_inl:255:24),_0>
            (&p2.super_QPromiseBase<int>,(anon_class_8_1_a8c68091)&v1);
  p2.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011b880;
  local_110 = p0.super_QPromiseBase<int>.m_d.d;
  if (p0.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar13 = &((p0.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
               super_QSharedData;
    (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_118 = &PTR__QPromiseBase_0011b880;
  local_100 = p1.super_QPromiseBase<int>.m_d.d;
  if (p1.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar13 = &((p1.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
               super_QSharedData;
    (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_108 = &PTR__QPromiseBase_0011b880;
  local_f0 = p2.super_QPromiseBase<int>.m_d.d;
  if (p2.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar13 = &((p2.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
               super_QSharedData;
    (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_e8 = &PTR__QPromiseBase_0011b880;
  local_f8 = &PTR__QPromiseBase_0011b880;
  lVar14 = 8;
  bVar16 = false;
  do {
    pPVar3 = *(PromiseDataBase<int,_void_(const_int_&)> **)((long)&local_118 + lVar14);
    bVar8 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending(pPVar3);
    bVar8 = (bool)(~bVar8 & (pPVar3->m_error).m_data._M_exception_object == (void *)0x0);
    local_98._M_pod_data[0] = bVar8;
    local_50._M_pod_data[0] = '\x01';
    pcVar11 = QTest::toString<bool>((bool *)local_98._M_pod_data);
    pcVar12 = QTest::toString<bool>((bool *)local_50._M_pod_data);
    reject = "p.isFulfilled()";
    cVar9 = QTest::compare_helper
                      (bVar8,"Compared values are not the same",pcVar11,pcVar12,"p.isFulfilled()",
                       "true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_resolve.cpp"
                       ,0x2e);
    if (cVar9 == '\0') break;
    lVar14 = lVar14 + 0x10;
    bVar16 = lVar14 == 0x38;
  } while (!bVar16);
  lVar14 = 0x30;
  do {
    *(undefined ***)((long)&uStack_128 + lVar14) = &PTR__QPromiseBase_0011b6b8;
    lVar4 = *(long *)((long)&local_120.d + lVar14);
    if (lVar4 != 0) {
      LOCK();
      piVar1 = (int *)(lVar4 + 8);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if ((*piVar1 == 0) &&
         (plVar5 = *(long **)((long)&local_120.d + lVar14), plVar5 != (long *)0x0)) {
        (**(code **)(*plVar5 + 8))();
      }
    }
    lVar14 = lVar14 + -0x10;
  } while (lVar14 != 0);
  if (bVar16) {
    local_110 = p0.super_QPromiseBase<int>.m_d.d;
    if (p0.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar13 = &((p0.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>
                 ).super_QSharedData;
      (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_118 = local_e8;
    local_100 = p1.super_QPromiseBase<int>.m_d.d;
    if (p1.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar13 = &((p1.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>
                 ).super_QSharedData;
      (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_108 = local_e8;
    local_f0 = p2.super_QPromiseBase<int>.m_d.d;
    if (p2.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar13 = &((p2.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>
                 ).super_QSharedData;
      (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_f8 = local_e8;
    ppuVar15 = (undefined **)0x0;
    local_60 = (_func_int **)&PTR__PromiseDataBase_0011b7c8;
    local_70 = (_func_int **)&PTR__PromiseDataBase_0011b750;
    local_68 = (_func_int **)&PTR__QPromiseBase_0011b730;
    local_78 = (_func_int **)&PTR__QPromiseBase_0011b6e8;
    do {
      uStack_128._4_4_ = -1;
      this_00 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
      this_00->_vptr_PromiseDataBase = (_func_int **)0x0;
      *(undefined8 *)&this_00->super_QSharedData = 0;
      (this_00->m_catchers).d.ptr =
           (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *
           )0x0;
      (this_00->m_catchers).d.size = 0;
      (this_00->m_handlers).d.size = 0;
      (this_00->m_catchers).d.d = (Data *)0x0;
      (this_00->m_handlers).d.d = (Data *)0x0;
      (this_00->m_handlers).d.ptr =
           (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
      *(undefined8 *)&this_00->m_lock = 0;
      *(undefined8 *)&this_00->m_settled = 0;
      (this_00->m_error).m_data._M_exception_object = (void *)0x0;
      this_00->_vptr_PromiseDataBase = local_60;
      QReadWriteLock::QReadWriteLock(&this_00->m_lock,0);
      pp_Var7 = local_68;
      this_00->m_settled = false;
      (this_00->m_handlers).d.d = (Data *)0x0;
      (this_00->m_handlers).d.ptr =
           (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
      (this_00->m_handlers).d.size = 0;
      (this_00->m_catchers).d.d = (Data *)0x0;
      (this_00->m_catchers).d.ptr =
           (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *
           )0x0;
      (this_00->m_catchers).d.size = 0;
      (this_00->m_error).m_data._M_exception_object = (void *)0x0;
      this_00->_vptr_PromiseDataBase = local_70;
      LOCK();
      (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i =
           (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
           ._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      pQVar13 = &this_00->super_QSharedData;
      LOCK();
      (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i =
           (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
           ._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      local_c0.super_QPromiseBase<void>._vptr_QPromiseBase = local_78;
      local_c0.super_QPromiseBase<void>.m_d.d = (PromiseData<void> *)this_00;
      QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver,&local_c0);
      local_c0.super_QPromiseBase<void>._vptr_QPromiseBase = pp_Var7;
      if (&(local_c0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()> !=
          (PromiseDataBase<void,_void_()> *)0x0) {
        LOCK();
        pQVar2 = &((local_c0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
                  super_QSharedData;
        (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i == 0) &&
           (&(local_c0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()> !=
            (PromiseDataBase<void,_void_()> *)0x0)) {
          (*((local_c0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
            _vptr_PromiseDataBase[1])();
        }
      }
      PVar6.m_d.d = resolver.m_d.d;
      if (resolver.m_d.d != (Data *)0x0) {
        LOCK();
        *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
        UNLOCK();
      }
      local_138 = resolver.m_d.d;
      if (resolver.m_d.d != (Data *)0x0) {
        LOCK();
        *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
        UNLOCK();
      }
      local_120 = resolver.m_d.d;
      local_e8 = ppuVar15;
      pPVar3 = *(PromiseDataBase<int,_void_(const_int_&)> **)((long)&local_110 + (long)ppuVar15);
      if (resolver.m_d.d != (Data *)0x0) {
        LOCK();
        *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
        UNLOCK();
        LOCK();
        *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
        UNLOCK();
      }
      local_88 = (_Manager_type)0x0;
      p_Stack_80 = (_Invoker_type)0x0;
      local_98._M_unused._M_object = (void *)0x0;
      local_98._8_8_ = 0;
      local_98._M_unused._M_object = operator_new(0x18);
      ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
      local_98._M_unused._0_8_)->d = (Data *)PVar6.m_d.d;
      if (PVar6.m_d.d != (Data *)0x0) {
        LOCK();
        *(int *)PVar6.m_d.d = *(int *)PVar6.m_d.d + 1;
        UNLOCK();
      }
      ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
      ((long)local_98._M_unused._0_8_ + 8))->d = (Data *)PVar6.m_d.d;
      if (PVar6.m_d.d == (Data *)0x0) {
        ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
        ((long)local_98._M_unused._0_8_ + 0x10))->d = (Data *)((long)&uStack_128 + 4);
        p_Stack_80 = std::
                     _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                     ::_M_invoke;
        local_88 = std::
                   _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                   ::_M_manager;
      }
      else {
        LOCK();
        *(int *)PVar6.m_d.d = *(int *)PVar6.m_d.d + 1;
        UNLOCK();
        ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
        ((long)local_98._M_unused._0_8_ + 0x10))->d = (Data *)((long)&uStack_128 + 4);
        p_Stack_80 = std::
                     _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                     ::_M_invoke;
        local_88 = std::
                   _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                   ::_M_manager;
        LOCK();
        *(int *)PVar6.m_d.d = *(int *)PVar6.m_d.d + -1;
        UNLOCK();
        if (*(int *)PVar6.m_d.d == 0) {
          operator_delete((void *)PVar6.m_d.d,0x10);
        }
      }
      if (PVar6.m_d.d != (Data *)0x0) {
        LOCK();
        *(int *)PVar6.m_d.d = *(int *)PVar6.m_d.d + -1;
        UNLOCK();
        if (*(int *)PVar6.m_d.d == 0) {
          operator_delete((void *)PVar6.m_d.d,0x10);
        }
      }
      QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
                (pPVar3,(function<void_(const_int_&)> *)&local_98);
      ppuVar15 = local_e8;
      if (local_88 != (_Manager_type)0x0) {
        (*local_88)(&local_98,&local_98,__destroy_functor);
      }
      pPVar3 = *(PromiseDataBase<int,_void_(const_int_&)> **)((long)&local_110 + (long)ppuVar15);
      QtPromisePrivate::PromiseCatcher<int,decltype(nullptr),void>::
      create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>
                ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_50,
                 (PromiseCatcher<int,decltype(nullptr),void> *)0x0,&local_138,
                 (QPromiseResolve<void> *)&local_120,(QPromiseReject<void> *)reject);
      QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
                (pPVar3,(function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_50);
      if (local_40 != (code *)0x0) {
        (*local_40)(&local_50,&local_50,__destroy_functor);
      }
      if (local_120.d != (Data *)0x0) {
        LOCK();
        ((local_120.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)
              ((local_120.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
        UNLOCK();
        if (((__int_type)
             ((local_120.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 0) &&
           (local_120.d != (Data *)0x0)) {
          operator_delete(local_120.d,0x10);
        }
      }
      if (local_138.d != (Data *)0x0) {
        LOCK();
        ((local_138.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
             ((local_138.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((local_138.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) &&
           (local_138.d != (Data *)0x0)) {
          operator_delete(local_138.d,0x10);
        }
      }
      if (resolver.m_d.d != (Data *)0x0) {
        LOCK();
        *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
        UNLOCK();
        if ((*(int *)resolver.m_d.d == 0) && (resolver.m_d.d != (Data *)0x0)) {
          operator_delete((void *)resolver.m_d.d,0x10);
        }
      }
      bVar16 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                         (*(PromiseDataBase<int,_void_(const_int_&)> **)
                           ((long)&local_110 + (long)ppuVar15));
      if (!bVar16) {
        QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
                  (*(PromiseDataBase<int,_void_(const_int_&)> **)((long)&local_110 + (long)ppuVar15)
                  );
      }
      bVar16 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(this_00);
      while (bVar16 != false) {
        QCoreApplication::processEvents();
        QCoreApplication::sendPostedEvents((QObject *)0x0,0x34);
        bVar16 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(this_00);
      }
      LOCK();
      (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i == 0) {
        (*this_00->_vptr_PromiseDataBase[1])(this_00);
      }
      LOCK();
      (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i == 0) {
        (*this_00->_vptr_PromiseDataBase[1])(this_00);
      }
      reject = 
      "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_resolve.cpp"
      ;
      bVar10 = QTest::qCompare(uStack_128._4_4_,0x2a,"waitForValue(p, -1)","42",
                               "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_resolve.cpp"
                               ,0x31);
      ppuVar15 = ppuVar15 + 2;
    } while ((bVar10 & ppuVar15 != (undefined **)0x30) != 0);
    lVar14 = 0x30;
    do {
      *(undefined ***)((long)&uStack_128 + lVar14) = &PTR__QPromiseBase_0011b6b8;
      lVar4 = *(long *)((long)&local_120.d + lVar14);
      if (lVar4 != 0) {
        LOCK();
        piVar1 = (int *)(lVar4 + 8);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if ((*piVar1 == 0) &&
           (plVar5 = *(long **)((long)&local_120.d + lVar14), plVar5 != (long *)0x0)) {
          (**(code **)(*plVar5 + 8))();
        }
      }
      lVar14 = lVar14 + -0x10;
    } while (lVar14 != 0);
  }
  p2.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011b6b8;
  if (p2.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar13 = &((p2.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
               super_QSharedData;
    (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p2.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
      (*((p2.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  p1.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011b6b8;
  if (p1.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar13 = &((p1.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
               super_QSharedData;
    (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p1.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
      (*((p1.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  p0.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011b6b8;
  if (p0.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar13 = &((p0.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
               super_QSharedData;
    (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p0.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
      (*((p0.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  return;
}

Assistant:

void tst_qpromise_resolve::value()
{
    int v0 = 42;
    const int v1 = 42;

    auto p0 = QtPromise::QPromise<int>::resolve(42);
    auto p1 = QtPromise::QPromise<int>::resolve(v0);
    auto p2 = QtPromise::QPromise<int>::resolve(v1);

    Q_STATIC_ASSERT((std::is_same<decltype(p0), QtPromise::QPromise<int>>::value));
    Q_STATIC_ASSERT((std::is_same<decltype(p1), QtPromise::QPromise<int>>::value));
    Q_STATIC_ASSERT((std::is_same<decltype(p2), QtPromise::QPromise<int>>::value));

    for (const auto& p : {p0, p1, p2}) {
        QCOMPARE(p.isFulfilled(), true);
    }
    for (const auto& p : {p0, p1, p2}) {
        QCOMPARE(waitForValue(p, -1), 42);
    }
}